

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall Player::~Player(Player *this)

{
  Player *this_local;
  
  Logout(this);
  std::vector<Character_*,_std::allocator<Character_*>_>::~vector(&this->characters);
  std::__cxx11::string::~string((string *)&this->dutylast);
  std::__cxx11::string::~string((string *)&this->username);
  return;
}

Assistant:

Player::~Player()
{
	this->Logout();
}